

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cc
# Opt level: O2

uint32_t phosg::crc32(void *vdata,size_t size,uint32_t cs)

{
  uint uVar1;
  size_t offset;
  size_t sVar2;
  
  uVar1 = ~cs;
  for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = uVar1 >> 8 ^
            *(uint *)(crc32_table + (ulong)(byte)(*(byte *)((long)vdata + sVar2) ^ (byte)uVar1) * 4)
    ;
  }
  return ~uVar1;
}

Assistant:

uint32_t crc32(const void* vdata, size_t size, uint32_t cs) {
  const uint8_t* data = reinterpret_cast<const uint8_t*>(vdata);

  cs = ~cs;
  for (size_t offset = 0; offset < size; offset++) {
    uint8_t table_offset = cs ^ data[offset];
    cs = (cs >> 8) ^ crc32_table[table_offset];
  }
  return ~cs;
}